

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O3

UA_StatusCode socket_write(UA_Connection *connection,UA_ByteString *buf)

{
  long lVar1;
  int *piVar2;
  ulong uVar3;
  ulong uVar4;
  UA_StatusCode UVar5;
  
  uVar3 = buf->length;
  uVar4 = 0;
  do {
    lVar1 = send(connection->sockfd,buf->data + uVar4,uVar3 - uVar4,0);
    if (lVar1 < 0) {
      piVar2 = __errno_location();
      do {
        if ((*piVar2 != 0xb) && (*piVar2 != 4)) {
          (*connection->close)(connection);
          connection->state = UA_CONNECTION_CLOSED;
          shutdown(connection->sockfd,2);
          close(connection->sockfd);
          UVar5 = 0x80ae0000;
          goto LAB_00129643;
        }
        lVar1 = send(connection->sockfd,buf->data + uVar4,buf->length - uVar4,0);
      } while (lVar1 < 0);
    }
    uVar4 = uVar4 + lVar1;
    uVar3 = buf->length;
    if (uVar3 <= uVar4) {
      UVar5 = 0;
LAB_00129643:
      deleteMembers_noInit(buf,UA_TYPES + 0xe);
      buf->length = 0;
      buf->data = (UA_Byte *)0x0;
      return UVar5;
    }
  } while( true );
}

Assistant:

static UA_StatusCode
socket_write(UA_Connection *connection, UA_ByteString *buf) {
    size_t nWritten = 0;
    do {
        ssize_t n = 0;
        do {
        /* If the OS throws EMSGSIZE, force a smaller packet size:
         * size_t bytes_to_send = buf->length - nWritten >  1024 ? 1024 : buf->length - nWritten; */
            size_t bytes_to_send = buf->length - nWritten;
            n = send((SOCKET)connection->sockfd, (const char*)buf->data + nWritten,
                     WIN32_INT bytes_to_send, 0);
            if(n < 0 && errno__ != INTERRUPTED && errno__ != AGAIN) {
                connection->close(connection);
                socket_close(connection);
                UA_ByteString_deleteMembers(buf);
                return UA_STATUSCODE_BADCONNECTIONCLOSED;
            }
        } while(n < 0);
        nWritten += (size_t)n;
    } while(nWritten < buf->length);
    UA_ByteString_deleteMembers(buf);
    return UA_STATUSCODE_GOOD;
}